

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_suite.cpp
# Opt level: O2

void __thiscall reader_url_suite::test_fragment_question::test_method(test_fragment_question *this)

{
  bool bVar1;
  uint local_358;
  value local_354;
  view_type local_350;
  undefined8 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  url reader;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  char *local_70;
  char input [41];
  
  local_350.ptr_ = input;
  builtin_strncpy(input + 0x20,"nt?query",9);
  builtin_strncpy(input + 0x10,".com/path#fragme",0x10);
  builtin_strncpy(input,"scheme://example",0x10);
  local_350.len_ = strlen(local_350.ptr_);
  trial::url::reader::basic_url<char>::basic_url(&reader,&local_350);
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_70 = "";
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_78,0x106);
  local_350.len_ = local_350.len_ & 0xffffffffffffff00;
  local_350.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_90 = "";
  local_354 = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_358 = 2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_350,&local_98,0x106,2,2,&local_354,"reader.subcode()",&local_358,
             "url::token::subcode::scheme");
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_a0 = "";
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a8,0x107);
  local_350.len_ = local_350.len_ & 0xffffffffffffff00;
  local_350.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_c0 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[7]>
            (&local_350,&local_c8,0x107,2,2,
             &reader.super_base<char,_trial::url::reader::basic_url>.current_view,"reader.literal()"
             ,"scheme","\"scheme\"");
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d8,0x108);
  local_350.len_ = local_350.len_ & 0xffffffffffffff00;
  local_350.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2f8 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_354 = CONCAT31(local_354._1_3_,bVar1);
  local_358 = CONCAT31(local_358._1_3_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_350,&local_300,0x108,2,2,&local_354,"reader.next()",&local_358,"true");
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f8,0x109);
  local_350.len_ = local_350.len_ & 0xffffffffffffff00;
  local_350.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_110 = "";
  local_354 = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_358 = 4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_350,&local_118,0x109,2,2,&local_354,"reader.subcode()",&local_358,
             "url::token::subcode::authority_host_name");
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_128,0x10a);
  local_350.len_ = local_350.len_ & 0xffffffffffffff00;
  local_350.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_140 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[12]>
            (&local_350,&local_148,0x10a,2,2,
             &reader.super_base<char,_trial::url::reader::basic_url>.current_view,"reader.literal()"
             ,"example.com","\"example.com\"");
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_158,0x10b);
  local_350.len_ = local_350.len_ & 0xffffffffffffff00;
  local_350.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_308 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_354 = CONCAT31(local_354._1_3_,bVar1);
  local_358 = CONCAT31(local_358._1_3_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_350,&local_310,0x10b,2,2,&local_354,"reader.next()",&local_358,"true");
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_178,0x10c);
  local_350.len_ = local_350.len_ & 0xffffffffffffff00;
  local_350.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_190 = "";
  local_354 = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_358 = 8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_350,&local_198,0x10c,2,2,&local_354,"reader.subcode()",&local_358,
             "url::token::subcode::path_segment");
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a8,0x10d);
  local_350.len_ = local_350.len_ & 0xffffffffffffff00;
  local_350.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1c0 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[5]>
            (&local_350,&local_1c8,0x10d,2,2,
             &reader.super_base<char,_trial::url::reader::basic_url>.current_view,"reader.literal()"
             ,"path","\"path\"");
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0x10e);
  local_350.len_ = local_350.len_ & 0xffffffffffffff00;
  local_350.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_318 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_354 = CONCAT31(local_354._1_3_,bVar1);
  local_358 = CONCAT31(local_358._1_3_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_350,&local_320,0x10e,2,2,&local_354,"reader.next()",&local_358,"true");
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f8,0x10f);
  local_350.len_ = local_350.len_ & 0xffffffffffffff00;
  local_350.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_210 = "";
  local_354 = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_358 = 0xc;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_350,&local_218,0x10f,2,2,&local_354,"reader.subcode()",&local_358,
             "url::token::subcode::fragment");
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_228,0x110);
  local_350.len_ = local_350.len_ & 0xffffffffffffff00;
  local_350.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_240 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[15]>
            (&local_350,&local_248,0x110,2,2,
             &reader.super_base<char,_trial::url::reader::basic_url>.current_view,"reader.literal()"
             ,"fragment?query","\"fragment?query\"");
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_250 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_258,0x111);
  local_350.len_ = local_350.len_ & 0xffffffffffffff00;
  local_350.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_340 = &boost::unit_test::lazy_ostream::inst;
  local_338 = "";
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_328 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_354 = CONCAT31(local_354._1_3_,bVar1);
  local_358 = local_358 & 0xffffff00;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_350,&local_330,0x111,2,2,&local_354,"reader.next()",&local_358,"false");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_fragment_question)
{
    const char input[] = "scheme://example.com/path#fragment?query";
    url::reader::url reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::scheme);
    BOOST_REQUIRE_EQUAL(reader.literal(), "scheme");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::authority_host_name);
    BOOST_REQUIRE_EQUAL(reader.literal(), "example.com");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::path_segment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "path");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::fragment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "fragment?query");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}